

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EmptyQueueExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyQueueExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  EmptyQueueExpressionSyntax *pEVar11;
  
  pEVar11 = (EmptyQueueExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyQueueExpressionSyntax *)this->endPtr < pEVar11 + 1) {
    pEVar11 = (EmptyQueueExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pEVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pEVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       EmptyQueueExpression;
  (pEVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pEVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pEVar11->openBrace).kind = TVar3;
  (pEVar11->openBrace).field_0x2 = uVar4;
  (pEVar11->openBrace).numFlags = (NumericTokenFlags)NVar5.raw;
  (pEVar11->openBrace).rawLen = uVar6;
  (pEVar11->openBrace).info = pIVar1;
  (pEVar11->closeBrace).kind = TVar7;
  (pEVar11->closeBrace).field_0x2 = uVar8;
  (pEVar11->closeBrace).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar11->closeBrace).rawLen = uVar10;
  (pEVar11->closeBrace).info = pIVar2;
  return pEVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }